

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void btreeParseCellAdjustSizeForOverflow(MemPage *pPage,u8 *pCell,CellInfo *pInfo)

{
  ushort uVar1;
  uint uVar2;
  
  uVar1 = pPage->minLocal;
  uVar2 = (pInfo->nPayload - (uint)uVar1) % (pPage->pBt->usableSize - 4) + (uint)uVar1;
  if ((int)(uint)pPage->maxLocal < (int)uVar2) {
    uVar2 = (uint)uVar1;
  }
  pInfo->nLocal = (u16)uVar2;
  pInfo->nSize = (((u16)uVar2 + (short)*(undefined4 *)&pInfo->pPayload) - (short)pCell) + 4;
  return;
}

Assistant:

static SQLITE_NOINLINE void btreeParseCellAdjustSizeForOverflow(
  MemPage *pPage,         /* Page containing the cell */
  u8 *pCell,              /* Pointer to the cell text. */
  CellInfo *pInfo         /* Fill in this structure */
){
  /* If the payload will not fit completely on the local page, we have
  ** to decide how much to store locally and how much to spill onto
  ** overflow pages.  The strategy is to minimize the amount of unused
  ** space on overflow pages while keeping the amount of local storage
  ** in between minLocal and maxLocal.
  **
  ** Warning:  changing the way overflow payload is distributed in any
  ** way will result in an incompatible file format.
  */
  int minLocal;  /* Minimum amount of payload held locally */
  int maxLocal;  /* Maximum amount of payload held locally */
  int surplus;   /* Overflow payload available for local storage */

  minLocal = pPage->minLocal;
  maxLocal = pPage->maxLocal;
  surplus = minLocal + (pInfo->nPayload - minLocal)%(pPage->pBt->usableSize-4);
  testcase( surplus==maxLocal );
  testcase( surplus==maxLocal+1 );
  if( surplus <= maxLocal ){
    pInfo->nLocal = (u16)surplus;
  }else{
    pInfo->nLocal = (u16)minLocal;
  }
  pInfo->nSize = (u16)(&pInfo->pPayload[pInfo->nLocal] - pCell) + 4;
}